

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

bool __thiscall HEkk::debugOneNonbasicMoveVsWorkArraysOk(HEkk *this,HighsInt var)

{
  double dVar1;
  HighsLogOptions *pHVar2;
  value_type vVar3;
  char *pcVar4;
  double dVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  uint *puVar12;
  uint in_ESI;
  long in_RDI;
  bool ok;
  HighsOptions *options;
  SimplexBasis *basis;
  HighsSimplexInfo *info;
  HighsLp *lp;
  bool local_39;
  
  puVar12 = (uint *)(in_RDI + 0x2198);
  lVar8 = *(long *)(in_RDI + 8);
  pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                       (long)(int)in_ESI);
  if (*pvVar10 == '\0') {
    return true;
  }
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                       (long)(int)in_ESI);
  bVar9 = highs_isInfinity(-*pvVar11);
  if (bVar9) {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                         (long)(int)in_ESI);
    bVar9 = highs_isInfinity(*pvVar11);
    if (bVar9) {
      pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                           (long)(int)in_ESI);
      cVar6 = *pvVar10;
      if (cVar6 != '\0') {
        uVar7 = *puVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                             (long)(int)in_ESI);
        pHVar2 = (HighsLogOptions *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        vVar3 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                             (long)(int)in_ESI);
        pcVar4 = (char *)*pvVar11;
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                             (long)(int)in_ESI);
        highsLogDev(pHVar2,(HighsLogType)vVar3,pcVar4,lVar8 + 0x380,5,
                    "Free variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be zero but is  %d\n"
                    ,(ulong)in_ESI,(ulong)uVar7,(ulong)(uint)(int)*pvVar10);
        return cVar6 == '\0';
      }
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                           (long)(int)in_ESI);
      local_39 = *pvVar11 == 0.0;
      if (!local_39) {
        uVar7 = *puVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        highsLogDev((HighsLogOptions *)*pvVar11,(HighsLogType)(lVar8 + 0x380),(char *)0x5,
                    "Free variable %d (lp.num_col_ = %d) so work value should be zero but is %g\n",
                    (ulong)in_ESI,(ulong)uVar7);
        return local_39;
      }
    }
    else {
      pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                           (long)(int)in_ESI);
      cVar6 = *pvVar10;
      if (cVar6 != -1) {
        uVar7 = *puVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                             (long)(int)in_ESI);
        pHVar2 = (HighsLogOptions *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        vVar3 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                             (long)(int)in_ESI);
        pcVar4 = (char *)*pvVar11;
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                             (long)(int)in_ESI);
        highsLogDev(pHVar2,(HighsLogType)vVar3,pcVar4,lVar8 + 0x380,5,
                    "Finite upper bound and infinite lower bound variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be down but is  %d\n"
                    ,(ulong)in_ESI,(ulong)uVar7,(ulong)(uint)(int)*pvVar10);
        return cVar6 == -1;
      }
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                           (long)(int)in_ESI);
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                           (long)(int)in_ESI);
      local_39 = dVar1 == *pvVar11;
      if (!local_39) {
        uVar7 = *puVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                             (long)(int)in_ESI);
        pHVar2 = (HighsLogOptions *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        highsLogDev(pHVar2,(HighsLogType)*pvVar11,(char *)(lVar8 + 0x380),5,
                    "Finite upper bound and infinite lower bound variable %d (lp.num_col_ = %d) so work value should be %g but is %g\n"
                    ,(ulong)in_ESI,(ulong)uVar7);
        return local_39;
      }
    }
  }
  else {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                         (long)(int)in_ESI);
    bVar9 = highs_isInfinity(*pvVar11);
    if (bVar9) {
      pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                          ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                           (long)(int)in_ESI);
      cVar6 = *pvVar10;
      if (cVar6 != '\x01') {
        uVar7 = *puVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                             (long)(int)in_ESI);
        pHVar2 = (HighsLogOptions *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        vVar3 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                             (long)(int)in_ESI);
        pcVar4 = (char *)*pvVar11;
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                             (long)(int)in_ESI);
        highsLogDev(pHVar2,(HighsLogType)vVar3,pcVar4,lVar8 + 0x380,5,
                    "Finite lower bound and infinite upper bound variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be up=%2d but is  %d\n"
                    ,(ulong)in_ESI,(ulong)uVar7,1,(int)*pvVar10);
        return cVar6 == '\x01';
      }
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                           (long)(int)in_ESI);
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                           (long)(int)in_ESI);
      local_39 = dVar1 == *pvVar11;
      if (!local_39) {
        uVar7 = *puVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                             (long)(int)in_ESI);
        pHVar2 = (HighsLogOptions *)*pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        highsLogDev(pHVar2,(HighsLogType)*pvVar11,(char *)(lVar8 + 0x380),5,
                    "Finite lower bound and infinite upper bound variable %d (lp.num_col_ = %d) so work value should be %g but is %g\n"
                    ,(ulong)in_ESI,(ulong)uVar7);
        return local_39;
      }
    }
    else {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                           (long)(int)in_ESI);
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                           (long)(int)in_ESI);
      if ((dVar1 != *pvVar11) || (NAN(dVar1) || NAN(*pvVar11))) {
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                             (long)(int)in_ESI);
        bVar9 = true;
        if (*pvVar10 != '\x01') {
          pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                              ((vector<signed_char,_std::allocator<signed_char>_> *)
                               (in_RDI + 0x29a8),(long)(int)in_ESI);
          bVar9 = *pvVar10 == -1;
        }
        if (!bVar9) {
          uVar7 = *puVar12;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                               (long)(int)in_ESI);
          pHVar2 = (HighsLogOptions *)*pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                               (long)(int)in_ESI);
          vVar3 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                               (long)(int)in_ESI);
          pcVar4 = (char *)*pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                               (long)(int)in_ESI);
          dVar1 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                               (long)(int)in_ESI);
          dVar5 = *pvVar11;
          pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                              ((vector<signed_char,_std::allocator<signed_char>_> *)
                               (in_RDI + 0x29a8),(long)(int)in_ESI);
          highsLogDev(pHVar2,(HighsLogType)vVar3,pcVar4,dVar1 - dVar5,lVar8 + 0x380,5,
                      "Boxed variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] range %g so nonbasic move should be up/down but is  %d\n"
                      ,(ulong)in_ESI,(ulong)uVar7,(ulong)(uint)(int)*pvVar10);
          return bVar9;
        }
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                             (long)(int)in_ESI);
        if (*pvVar10 == '\x01') {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                               (long)(int)in_ESI);
          dVar1 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                               (long)(int)in_ESI);
          local_39 = dVar1 == *pvVar11;
          if (!local_39) {
            uVar7 = *puVar12;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                                 (long)(int)in_ESI);
            pHVar2 = (HighsLogOptions *)*pvVar11;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                                 (long)(int)in_ESI);
            highsLogDev(pHVar2,(HighsLogType)*pvVar11,(char *)(lVar8 + 0x380),5,
                        "Boxed variable %d (lp.num_col_ = %d) with kNonbasicMoveUp so work value should be %g but is %g\n"
                        ,(ulong)in_ESI,(ulong)uVar7);
            return local_39;
          }
        }
        else {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                               (long)(int)in_ESI);
          dVar1 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                               (long)(int)in_ESI);
          local_39 = dVar1 == *pvVar11;
          if (!local_39) {
            uVar7 = *puVar12;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                                 (long)(int)in_ESI);
            pHVar2 = (HighsLogOptions *)*pvVar11;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                                 (long)(int)in_ESI);
            highsLogDev(pHVar2,(HighsLogType)*pvVar11,(char *)(lVar8 + 0x380),5,
                        "Boxed variable %d (lp.num_col_ = %d) with kNonbasicMoveDn so work value should be %g but is %g\n"
                        ,(ulong)in_ESI,(ulong)uVar7);
            return local_39;
          }
        }
      }
      else {
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                             (long)(int)in_ESI);
        cVar6 = *pvVar10;
        if (cVar6 != '\0') {
          uVar7 = *puVar12;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                               (long)(int)in_ESI);
          pHVar2 = (HighsLogOptions *)*pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                               (long)(int)in_ESI);
          vVar3 = *pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                               (long)(int)in_ESI);
          pcVar4 = (char *)*pvVar11;
          pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                              ((vector<signed_char,_std::allocator<signed_char>_> *)
                               (in_RDI + 0x29a8),(long)(int)in_ESI);
          highsLogDev(pHVar2,(HighsLogType)vVar3,pcVar4,lVar8 + 0x380,5,
                      "Fixed variable %d (lp.num_col_ = %d) [%11g, %11g, %11g] so nonbasic move should be zero but is %d\n"
                      ,(ulong)in_ESI,(ulong)uVar7,(ulong)(uint)(int)*pvVar10);
          return cVar6 == '\0';
        }
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                             (long)(int)in_ESI);
        dVar1 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                             (long)(int)in_ESI);
        local_39 = dVar1 == *pvVar11;
        if (!local_39) {
          uVar7 = *puVar12;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                               (long)(int)in_ESI);
          pHVar2 = (HighsLogOptions *)*pvVar11;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                               (long)(int)in_ESI);
          highsLogDev(pHVar2,(HighsLogType)*pvVar11,(char *)(lVar8 + 0x380),5,
                      "Fixed variable %d (lp.num_col_ = %d) so info.work value should be %g but is %g\n"
                      ,(ulong)in_ESI,(ulong)uVar7);
          return local_39;
        }
      }
    }
  }
  return local_39;
}

Assistant:

bool HEkk::debugOneNonbasicMoveVsWorkArraysOk(const HighsInt var) const {
  const HighsLp& lp = this->lp_;
  const HighsSimplexInfo& info = this->info_;
  const SimplexBasis& basis = this->basis_;
  const HighsOptions& options = *(this->options_);
  assert(var >= 0);
  assert(var < lp.num_col_ + lp.num_row_);
  // Make sure we're not checking a basic variable
  if (!basis.nonbasicFlag_[var]) return true;
  bool ok;
  if (!highs_isInfinity(-info.workLower_[var])) {
    if (!highs_isInfinity(info.workUpper_[var])) {
      // Finite lower and upper bounds so nonbasic move depends on whether they
      // are equal
      if (info.workLower_[var] == info.workUpper_[var]) {
        // Fixed variable
        ok = basis.nonbasicMove_[var] == kNonbasicMoveZe;
        if (!ok) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Fixed variable %" HIGHSINT_FORMAT
                      " (lp.num_col_ = %" HIGHSINT_FORMAT
                      ") [%11g, %11g, "
                      "%11g] so nonbasic "
                      "move should be zero but is %" HIGHSINT_FORMAT "\n",
                      var, lp.num_col_, info.workLower_[var],
                      info.workValue_[var], info.workUpper_[var],
                      basis.nonbasicMove_[var]);
          return ok;
        }
        ok = info.workValue_[var] == info.workLower_[var];
        if (!ok) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Fixed variable %" HIGHSINT_FORMAT
                      " (lp.num_col_ = %" HIGHSINT_FORMAT
                      ") so "
                      "info.work value should be %g but "
                      "is %g\n",
                      var, lp.num_col_, info.workLower_[var],
                      info.workValue_[var]);
          return ok;
        }
      } else {
        // Boxed variable
        ok = (basis.nonbasicMove_[var] == kNonbasicMoveUp) ||
             (basis.nonbasicMove_[var] == kNonbasicMoveDn);
        if (!ok) {
          highsLogDev(
              options.log_options, HighsLogType::kError,
              "Boxed variable %" HIGHSINT_FORMAT
              " (lp.num_col_ = %" HIGHSINT_FORMAT
              ") [%11g, %11g, "
              "%11g] range %g so "
              "nonbasic move should be up/down but is  %" HIGHSINT_FORMAT "\n",
              var, lp.num_col_, info.workLower_[var], info.workValue_[var],
              info.workUpper_[var], info.workUpper_[var] - info.workLower_[var],
              basis.nonbasicMove_[var]);
          return ok;
        }
        if (basis.nonbasicMove_[var] == kNonbasicMoveUp) {
          ok = info.workValue_[var] == info.workLower_[var];
          if (!ok) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Boxed variable %" HIGHSINT_FORMAT
                        " (lp.num_col_ = %" HIGHSINT_FORMAT
                        ") with "
                        "kNonbasicMoveUp so work "
                        "value should be %g but is %g\n",
                        var, lp.num_col_, info.workLower_[var],
                        info.workValue_[var]);
            return ok;
          }
        } else {
          ok = info.workValue_[var] == info.workUpper_[var];
          if (!ok) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Boxed variable %" HIGHSINT_FORMAT
                        " (lp.num_col_ = %" HIGHSINT_FORMAT
                        ") with "
                        "kNonbasicMoveDn so work "
                        "value should be %g but is %g\n",
                        var, lp.num_col_, info.workUpper_[var],
                        info.workValue_[var]);
            return ok;
          }
        }
      }
    } else {
      // Infinite upper bound
      ok = basis.nonbasicMove_[var] == kNonbasicMoveUp;
      if (!ok) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Finite lower bound and infinite upper bound variable "
                    "%" HIGHSINT_FORMAT
                    " "
                    "(lp.num_col_ = "
                    "%" HIGHSINT_FORMAT
                    ") [%11g, %11g, %11g] so nonbasic move should be "
                    "up=%2" HIGHSINT_FORMAT
                    " but is  "
                    "%" HIGHSINT_FORMAT "\n",
                    var, lp.num_col_, info.workLower_[var],
                    info.workValue_[var], info.workUpper_[var], kNonbasicMoveUp,
                    basis.nonbasicMove_[var]);
        return ok;
      }
      ok = info.workValue_[var] == info.workLower_[var];
      if (!ok) {
        highsLogDev(
            options.log_options, HighsLogType::kError,
            "Finite lower bound and infinite upper bound variable "
            "%" HIGHSINT_FORMAT
            " "
            "(lp.num_col_ = "
            "%" HIGHSINT_FORMAT ") so work value should be %g but is %g\n",
            var, lp.num_col_, info.workLower_[var], info.workValue_[var]);
        return ok;
      }
    }
  } else {
    // Infinite lower bound
    if (!highs_isInfinity(info.workUpper_[var])) {
      ok = basis.nonbasicMove_[var] == kNonbasicMoveDn;
      if (!ok) {
        highsLogDev(
            options.log_options, HighsLogType::kError,
            "Finite upper bound and infinite lower bound variable "
            "%" HIGHSINT_FORMAT
            " "
            "(lp.num_col_ = "
            "%" HIGHSINT_FORMAT
            ") [%11g, %11g, %11g] so nonbasic move should be down but is  "
            "%" HIGHSINT_FORMAT "\n",
            var, lp.num_col_, info.workLower_[var], info.workValue_[var],
            info.workUpper_[var], basis.nonbasicMove_[var]);
        return ok;
      }
      ok = info.workValue_[var] == info.workUpper_[var];
      if (!ok) {
        highsLogDev(
            options.log_options, HighsLogType::kError,
            "Finite upper bound and infinite lower bound variable "
            "%" HIGHSINT_FORMAT
            " "
            "(lp.num_col_ = "
            "%" HIGHSINT_FORMAT ") so work value should be %g but is %g\n",
            var, lp.num_col_, info.workUpper_[var], info.workValue_[var]);
        return ok;
      }
    } else {
      // Infinite upper bound
      ok = basis.nonbasicMove_[var] == kNonbasicMoveZe;
      if (!ok) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Free variable %" HIGHSINT_FORMAT
                    " (lp.num_col_ = %" HIGHSINT_FORMAT
                    ") [%11g, %11g, %11g] "
                    "so nonbasic "
                    "move should be zero but is  %" HIGHSINT_FORMAT "\n",
                    var, lp.num_col_, info.workLower_[var],
                    info.workValue_[var], info.workUpper_[var],
                    basis.nonbasicMove_[var]);
        return ok;
      }
      ok = info.workValue_[var] == 0.0;
      if (!ok) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Free variable %" HIGHSINT_FORMAT
                    " (lp.num_col_ = %" HIGHSINT_FORMAT
                    ") so work value should "
                    "be zero but "
                    "is %g\n",
                    var, lp.num_col_, info.workValue_[var]);
        return ok;
      }
    }
  }
  // ok must be true if we reach here
  assert(ok);
  return ok;
}